

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

void __thiscall QString::reallocData(QString *this,qsizetype alloc,AllocationOption option)

{
  Data *pDVar1;
  undefined1 auVar2 [16];
  qsizetype qVar3;
  char16_t *__dest;
  long lVar4;
  long in_FS_OFFSET;
  pair<QTypedArrayData<char16_t>_*,_char16_t_*> local_40;
  long local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (alloc == 0) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = L"";
    local_40 = (pair<QTypedArrayData<char16_t>_*,_char16_t_*>)(auVar2 << 0x40);
    local_30 = 0;
    QArrayDataPointer<char16_t>::operator=(&this->d,(QArrayDataPointer<char16_t> *)&local_40);
  }
  else {
    qVar3 = QArrayDataPointer<char16_t>::freeSpaceAtBegin(&this->d);
    pDVar1 = (this->d).d;
    if (((pDVar1 != (Data *)0x0) && (qVar3 < 1)) &&
       ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        QtPrivate::QPodArrayOps<char16_t>::reallocate((QPodArrayOps<char16_t> *)this,alloc,option);
        return;
      }
      goto LAB_002eea0e;
    }
    lVar4 = (this->d).size;
    if (alloc <= lVar4) {
      lVar4 = alloc;
    }
    local_40 = QTypedArrayData<char16_t>::allocate(alloc,option);
    __dest = local_40.second;
    local_30 = lVar4;
    if (__dest == (char16_t *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        qBadAlloc();
      }
      goto LAB_002eea0e;
    }
    if (0 < lVar4) {
      memcpy(__dest,(this->d).ptr,lVar4 * 2);
    }
    __dest[lVar4] = L'\0';
    QArrayDataPointer<char16_t>::operator=(&this->d,(QArrayDataPointer<char16_t> *)&local_40);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
LAB_002eea0e:
  __stack_chk_fail();
}

Assistant:

void QString::reallocData(qsizetype alloc, QArrayData::AllocationOption option)
{
    if (!alloc) {
        d = DataPointer::fromRawData(&_empty, 0);
        return;
    }

    // don't use reallocate path when reducing capacity and there's free space
    // at the beginning: might shift data pointer outside of allocated space
    const bool cannotUseReallocate = d.freeSpaceAtBegin() > 0;

    if (d->needsDetach() || cannotUseReallocate) {
        DataPointer dd(alloc, qMin(alloc, d.size), option);
        Q_CHECK_PTR(dd.data());
        if (dd.size > 0)
            ::memcpy(dd.data(), d.data(), dd.size * sizeof(QChar));
        dd.data()[dd.size] = 0;
        d = dd;
    } else {
        d->reallocate(alloc, option);
    }
}